

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordering.hh
# Opt level: O2

int tchecker::
    lexical_cmp<tchecker::dbm::db_t_const*,tchecker::dbm::db_t_const*,int(*)(tchecker::dbm::db_t_const&,tchecker::dbm::db_t_const&)>
              (db_t **begin1,db_t **end1,db_t **begin2,db_t **end2,_func_int_db_t_ptr_db_t_ptr *cmp)

{
  int iVar1;
  db_t *pdVar2;
  db_t *pdVar3;
  
  pdVar2 = *begin1;
  pdVar3 = *begin2;
  while( true ) {
    if (pdVar2 == *end1) {
      return -(uint)(pdVar3 != *end2);
    }
    if (pdVar3 == *end2) {
      return 1;
    }
    iVar1 = (*cmp)(pdVar2,pdVar3);
    if (iVar1 < 0) {
      return -1;
    }
    if (iVar1 != 0) break;
    pdVar2 = pdVar2 + 1;
    pdVar3 = pdVar3 + 1;
  }
  return 1;
}

Assistant:

int lexical_cmp(I1 const & begin1, I1 const & end1, I2 const & begin2, I2 const & end2, CMP cmp)
{
  I1 it1 = begin1;
  I2 it2 = begin2;
  for (; 1; ++it1, ++it2) {
    if (it1 == end1)
      return (it2 == end2 ? 0 : -1);
    if (it2 == end2)
      return 1;
    int cmp_value = cmp(*it1, *it2);
    if (cmp_value < 0)
      return -1;
    if (cmp_value > 0)
      return 1;
  }
}